

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

double __thiscall ON_MorphControl::Weight(ON_MorphControl *this,ON_3dex ijk)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  int i;
  double dVar4;
  
  iVar3 = ijk.k;
  iVar1 = this->m_varient;
  i = ijk.i;
  if (iVar1 == 3) {
    pdVar2 = (this->m_nurbs_cage).m_cv;
    if ((pdVar2 != (double *)0x0) && ((this->m_nurbs_cage).m_is_rat == true)) {
      return pdVar2[(long)(iVar3 * (this->m_nurbs_cage).m_cv_stride[2] +
                           (this->m_nurbs_cage).m_cv_stride[0] * i +
                          (this->m_nurbs_cage).m_cv_stride[1] * ijk.j) +
                    (long)(this->m_nurbs_cage).m_dim];
    }
  }
  else if (iVar1 == 2) {
    if (iVar3 == 0) {
      dVar4 = ON_NurbsSurface::Weight(&this->m_nurbs_surface,i,ijk.j);
      return dVar4;
    }
  }
  else if ((iVar1 == 1) && (iVar3 == 0 && ijk._0_8_ >> 0x20 == 0)) {
    dVar4 = ON_NurbsCurve::Weight(&this->m_nurbs_curve,i);
    return dVar4;
  }
  return 1.0;
}

Assistant:

double ON_MorphControl::Weight(ON_3dex ijk) const
{
  double w = 1.0;

  switch(m_varient)
  {
  case 1:
    w = (0 == ijk.j && 0 == ijk.k) ? m_nurbs_curve.Weight(ijk.i) : 1.0;
    break;
  case 2:
    w = (0 == ijk.k) ? m_nurbs_surface.Weight(ijk.i,ijk.j) : 1.0;
    break;
  case 3:
    w = m_nurbs_cage.Weight(ijk.i,ijk.j,ijk.k);
    break;
  }

  return w;
}